

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat Eye(int n)

{
  void *__s;
  ulong uVar1;
  int iVar2;
  double *in_RDX;
  double *extraout_RDX;
  double *extraout_RDX_00;
  uint in_ESI;
  undefined4 in_register_0000003c;
  uint *puVar3;
  uint uVar4;
  Mat MVar5;
  
  puVar3 = (uint *)CONCAT44(in_register_0000003c,n);
  *puVar3 = in_ESI;
  puVar3[1] = in_ESI;
  uVar4 = in_ESI * in_ESI;
  if (in_ESI == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = operator_new__((ulong)uVar4 << 3);
    in_RDX = extraout_RDX;
  }
  *(void **)(puVar3 + 2) = __s;
  if (in_ESI != 0) {
    memset(__s,0,(ulong)(uVar4 + (uVar4 == 0)) << 3);
    in_RDX = extraout_RDX_00;
  }
  if (0 < (int)in_ESI) {
    uVar1 = (ulong)in_ESI;
    iVar2 = 0;
    in_RDX = (double *)0x3ff0000000000000;
    do {
      *(undefined8 *)((long)__s + (long)iVar2 * 8) = 0x3ff0000000000000;
      iVar2 = iVar2 + in_ESI + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  MVar5.v_ = in_RDX;
  MVar5._0_8_ = puVar3;
  return MVar5;
}

Assistant:

Mat Eye(const int n)
{
	Mat eyeMat(n, n);
	for (int j=0; j<n*n; j++)
		eyeMat.v_[j] = 0.0;
	for (int i=0; i<n; i++)
		eyeMat.v_[i*n + i] = 1.0;
	return eyeMat;
}